

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snake.cpp
# Opt level: O3

void __thiscall Snake::UpdateHead(Snake *this)

{
  float fVar1;
  double dVar2;
  
  switch(*(undefined4 *)this) {
  case 0:
    fVar1 = *(float *)(this + 0x14) - *(float *)(this + 4);
    break;
  case 1:
    fVar1 = *(float *)(this + 4) + *(float *)(this + 0x14);
    break;
  case 2:
    fVar1 = *(float *)(this + 0x10) - *(float *)(this + 4);
    goto LAB_0010708a;
  case 3:
    fVar1 = *(float *)(this + 4) + *(float *)(this + 0x10);
LAB_0010708a:
    *(float *)(this + 0x10) = fVar1;
  default:
    goto switchD_00107066_default;
  }
  *(float *)(this + 0x14) = fVar1;
switchD_00107066_default:
  dVar2 = fmod((double)((float)*(int *)(this + 0x34) + *(float *)(this + 0x10)),
               (double)*(int *)(this + 0x34));
  *(float *)(this + 0x10) = (float)dVar2;
  dVar2 = fmod((double)((float)*(int *)(this + 0x38) + *(float *)(this + 0x14)),
               (double)*(int *)(this + 0x38));
  *(float *)(this + 0x14) = (float)dVar2;
  return;
}

Assistant:

void Snake::UpdateHead() {
  switch (direction) {
    case Direction::kUp:
      head_y -= speed;
      break;

    case Direction::kDown:
      head_y += speed;
      break;

    case Direction::kLeft:
      head_x -= speed;
      break;

    case Direction::kRight:
      head_x += speed;
      break;
  }

  // Wrap the Snake around to the beginning if going off of the screen.
  head_x = fmod(head_x + grid_width, grid_width);
  head_y = fmod(head_y + grid_height, grid_height);
}